

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O0

void __thiscall luna::State::CallClosure(State *this,Value *f,int expect_result)

{
  bool bVar1;
  int iVar2;
  Function *this_00;
  list<luna::CallInfo,_std::allocator<luna::CallInfo>_> *this_01;
  size_t sVar3;
  Value *pVVar4;
  int in_EDX;
  Value *in_RSI;
  value_type *in_RDI;
  Value *arg_1;
  Value *new_top;
  int i;
  int count;
  Value *top;
  int fixed_args;
  Value *arg;
  Function *callee_proto;
  CallInfo callee;
  Value *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  Value *local_78;
  int local_68;
  Value *local_60;
  Value *local_50;
  CallInfo local_40;
  int local_14;
  Value *local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  CallInfo::CallInfo(&local_40);
  this_00 = Closure::GetPrototype((local_10->field_0).closure_);
  local_40.func_ = local_10;
  this_01 = (list<luna::CallInfo,_std::allocator<luna::CallInfo>_> *)
            Function::GetOpCodes
                      ((Function *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  local_40.instruction_ = (Instruction *)this_01;
  sVar3 = Function::OpCodeSize((Function *)0x1ef17a);
  local_40.end_ =
       (Instruction *)
       ((long)&(this_01->super__List_base<luna::CallInfo,_std::allocator<luna::CallInfo>_>)._M_impl.
               _M_node.super__List_node_base._M_next + sVar3 * 4);
  local_40.expect_result_ = local_14;
  pVVar4 = local_10 + 1;
  iVar2 = Function::FixedArgCount(this_00);
  bVar1 = Function::HasVararg(this_00);
  if (bVar1) {
    local_40.register_ = (Value *)in_RDI[1].end_;
    local_60 = local_40.register_;
    local_50 = pVVar4;
    for (local_68 = 0; bVar1 = local_68 < (int)((long)local_40.register_ - (long)pVVar4 >> 4),
        in_stack_ffffffffffffff77 = bVar1 && local_68 < iVar2, bVar1 && local_68 < iVar2;
        local_68 = local_68 + 1) {
      local_60->field_0 = local_50->field_0;
      local_60->type_ = local_50->type_;
      local_60 = local_60 + 1;
      local_50 = local_50 + 1;
    }
  }
  else {
    local_40.register_ = pVVar4;
    for (local_78 = (Value *)in_RDI[1].end_; local_78 < pVVar4 + iVar2; local_78 = local_78 + 1) {
      Value::SetNil(local_78);
    }
  }
  Stack::SetNewTop((Stack *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                   in_stack_ffffffffffffff68);
  std::__cxx11::list<luna::CallInfo,_std::allocator<luna::CallInfo>_>::push_back(this_01,in_RDI);
  return;
}

Assistant:

void State::CallClosure(Value *f, int expect_result)
    {
        CallInfo callee;
        Function *callee_proto = f->closure_->GetPrototype();

        callee.func_ = f;
        callee.instruction_ = callee_proto->GetOpCodes();
        callee.end_ = callee.instruction_ + callee_proto->OpCodeSize();
        callee.expect_result_ = expect_result;

        Value *arg = f + 1;
        int fixed_args = callee_proto->FixedArgCount();

        // Fixed arg start from base register
        if (callee_proto->HasVararg())
        {
            Value *top = stack_.top_;
            callee.register_ = top;
            int count = top - arg;
            for (int i = 0; i < count && i < fixed_args; ++i)
                *top++ = *arg++;
        }
        else
        {
            callee.register_ = arg;
            // fill nil for overflow args
            auto new_top = callee.register_ + fixed_args;
            for (auto arg = stack_.top_; arg < new_top; arg++)
            {
                arg->SetNil();
            }
        }

        stack_.SetNewTop(callee.register_ + fixed_args);
        calls_.push_back(callee);
    }